

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattices.cpp
# Opt level: O0

void __thiscall
ValTypeLattice_Compare_Test::~ValTypeLattice_Compare_Test(ValTypeLattice_Compare_Test *this)

{
  ValTypeLattice_Compare_Test *this_local;
  
  ~ValTypeLattice_Compare_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ValTypeLattice, Compare) {
  analysis::ValType valtype;
  testDiamondCompare(
    valtype, Type::unreachable, Type::i32, Type::f32, Type::none);
  testDiamondCompare(valtype,
                     Type(HeapType::none, NonNullable),
                     Type(HeapType::struct_, NonNullable),
                     Type(HeapType::array, Nullable),
                     Type(HeapType::eq, Nullable));
}